

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O2

bool TasOptimization::testGradientDescent(bool verbose)

{
  vector<double,_std::allocator<double>_> *this;
  int i_1;
  int i;
  long lVar1;
  int iVar2;
  bool pass;
  bool bVar3;
  GradientDescentState state;
  ProjectionFunctionSingle proj;
  vector<double,_std::allocator<double>_> x_optimal;
  vector<double,_std::allocator<double>_> x_gd;
  GradientFunctionSingle grad;
  vector<double,_std::allocator<double>_> x0;
  ObjectiveFunctionSingle func;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  func.super__Function_base._M_manager = (_Manager_type)0x0;
  func._M_invoker = (_Invoker_type)0x0;
  func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  func.super__Function_base._M_functor._8_8_ = 0;
  grad.super__Function_base._M_manager = (_Manager_type)0x0;
  grad._M_invoker = (_Invoker_type)0x0;
  grad.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  grad.super__Function_base._M_functor._8_8_ = 0;
  std::vector<double,_std::allocator<double>_>::vector(&x_optimal,0xb,(allocator_type *)&state);
  makeNesterovTestFunction(10.0,5,&func,&grad,&x_optimal);
  state.adaptive_stepsize = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&x0,0xb,&state.adaptive_stepsize,(allocator_type *)&proj);
  this = &state.x;
  state.adaptive_stepsize = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(this,&x0);
  TasOptimization::GradientDescent((function *)&grad,0.1,300,1e-06,(vector *)this);
  std::vector<double,_std::allocator<double>_>::vector(&x_gd,this);
  pass = true;
  for (lVar1 = 0; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    pass = (bool)(pass & ABS(x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1] -
                             x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1]) <= 1e-06);
  }
  GradientDescentState::setX(&state,&x0);
  iVar2 = 300;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    TasOptimization::GradientDescent((function *)&grad,0.1,1,1e-06,(vector *)&state.x);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&proj,&state.x);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&x_gd,&proj);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&proj);
  for (lVar1 = 0; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    pass = (bool)(pass & ABS(x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1] -
                             x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1]) <= 1e-06);
  }
  state.adaptive_stepsize = 1.0;
  GradientDescentState::setX(&state,&x0);
  TasOptimization::GradientDescent((function *)&func,(function *)&grad,1.5,1.25,300,1e-06,&state);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&proj,&state.x);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&x_gd,&proj);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&proj);
  for (lVar1 = 0; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    pass = (bool)(pass & ABS(x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1] -
                             x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1]) <= 1e-06);
  }
  GradientDescentState::setX(&state,&x0);
  iVar2 = 300;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    TasOptimization::GradientDescent((function *)&func,(function *)&grad,1.5,1.25,1,1e-06,&state);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&proj,&state.x);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&x_gd,&proj);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&proj);
  for (lVar1 = 0; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    pass = (bool)(pass & ABS(x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1] -
                             x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1]) <= 1e-06);
  }
  proj.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  proj.super__Function_base._M_functor._8_8_ = 0;
  proj._M_invoker =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:308:37)>
       ::_M_invoke;
  proj.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:308:37)>
       ::_M_manager;
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar1] = (double)(int)lVar1 * -0.1 + 0.5;
  }
  state.adaptive_stepsize = 1.0;
  GradientDescentState::setX(&state,&x0);
  TasOptimization::GradientDescent
            ((function *)&func,(function *)&grad,(function *)&proj,1.5,1.25,300,1e-06,&state);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,&state.x);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&x_gd,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  for (lVar1 = 0; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    pass = (bool)(pass & ABS(x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1] -
                             x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1]) <= 1e-06);
  }
  iVar2 = 300;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    TasOptimization::GradientDescent
              ((function *)&func,(function *)&grad,(function *)&proj,1.5,1.25,1,1e-06,&state);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,&state.x);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&x_gd,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  for (lVar1 = 0; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    pass = (bool)(pass & ABS(x_gd.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1] -
                             x_optimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar1]) <= 1e-06);
  }
  if (((~pass | verbose) & 1U) != 0) {
    reportPassFail(pass,"Gradient Descent","Algorithm Unit Tests");
  }
  std::_Function_base::~_Function_base(&proj.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x_gd.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&state.x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x0.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x_optimal.super__Vector_base<double,_std::allocator<double>_>);
  std::_Function_base::~_Function_base(&grad.super__Function_base);
  std::_Function_base::~_Function_base(&func.super__Function_base);
  return pass;
}

Assistant:

bool testGradientDescent(bool verbose) {
    test_result test;

    // Nesterov's "worst function in the world".
    ObjectiveFunctionSingle func;
    GradientFunctionSingle grad;
    double L = 10;
    int num_dimensions = 11;
    std::vector<double> x_optimal(num_dimensions);
    makeNesterovTestFunction(L, (num_dimensions-1)/2, func, grad, x_optimal);

    // Constant stepsize gradient descent.
    std::vector<double> x0(num_dimensions, 0);
    GradientDescentState state(x0, 0);
    GradientDescent(grad, 1.0/L, 300, 1E-6, state);
    std::vector<double> x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    state.setX(x0);
    for (int t=0; t<300; t++) GradientDescent(grad, 1.0/L, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Variable stepsize gradient descent.
    state.setAdaptiveStepsize(10.0/L);
    state.setX(x0);
    GradientDescent(func, grad, 1.5, 1.25, 300, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    state.setX(x0);
    for (int t=0; t<300; t++) GradientDescent(func, grad, 1.5, 1.25, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Proximal/Projected gradient descent (optimum now lies on the boundary).
    ProjectionFunctionSingle proj = [](const std::vector<double> &x, std::vector<double> &p) {
        for (size_t i=0; i<p.size(); i++) p[i] = std::min(std::max(x[i], -0.5), 0.5);
    };
    for (int i=0; i<(num_dimensions-1)/2; i++) x_optimal[i] = 0.5 - 0.1 * i;
    state.setAdaptiveStepsize(10.0/L);
    state.setX(x0);
    GradientDescent(func, grad, proj, 1.5, 1.25, 300, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    for (int t=0; t<300; t++) GradientDescent(func, grad, proj, 1.5, 1.25, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Gradient Descent", "Algorithm Unit Tests");
    return test.success();
}